

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>_>::
disposeImpl(HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>_> *this,
           void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>_> *this_local;
  
  if (pointer != (void *)0x0) {
    anon_unknown_8::DiskHandle::ReplacerImpl<kj::Directory>::~ReplacerImpl
              ((ReplacerImpl<kj::Directory> *)pointer);
    operator_delete(pointer,0x60);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }